

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

either * toml::detail::syntax::basic_char(spec *s)

{
  sequence *in_RDI;
  anon_class_8_1_54a39813 *in_stack_00000048;
  anon_class_8_1_54a39813 basic_unescaped;
  spec *in_stack_00000178;
  sequence *in_stack_ffffffffffffffa0;
  either *in_stack_ffffffffffffffa8;
  either *in_stack_ffffffffffffffb0;
  
  basic_char::anon_class_8_1_54a39813::operator()(in_stack_00000048);
  escaped(in_stack_00000178);
  either::either<toml::detail::either,toml::detail::sequence>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  sequence::~sequence(in_RDI);
  either::~either((either *)in_RDI);
  return (either *)in_RDI;
}

Assistant:

TOML11_INLINE either basic_char(const spec& s)
{
    const auto basic_unescaped = [&s]() {
        return either(
                wschar(s),
                character(0x21),                // 22 is "
                character_in_range(0x23, 0x5B), // 5C is backslash
                character_in_range(0x5D, 0x7E), // 7F is DEL
                non_ascii(s)
            );
    };
    return either(basic_unescaped(), escaped(s));
}